

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbolsToAdopt,
          UParseError *param_3,UErrorCode *status)

{
  DecimalFormat(this,symbolsToAdopt,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::PatternParser::parseToExistingProperties
              (pattern,(this->fields->properties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
               IGNORE_ROUNDING_IF_CURRENCY,status);
  }
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, DecimalFormatSymbols* symbolsToAdopt,
                             UParseError&, UErrorCode& status)
        : DecimalFormat(symbolsToAdopt, status) {
    // TODO: What is parseError for?
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}